

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL3SLDropSetEnhER0Test
          (DatarateTestSVC *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var4;
  ostream *poVar5;
  ostream *poVar6;
  char *message;
  DatarateTestSVC *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_sl2;
  int bitrate_sl1;
  int bitrate_sl0;
  int i;
  int num_nonref;
  int n;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffde4;
  double *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  int line;
  uint in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  string *in_stack_fffffffffffffe08;
  Type TVar9;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  allocator *this_00;
  AssertionResult local_180 [2];
  int local_15c;
  AssertionResult local_158 [2];
  double local_138;
  AssertionResult local_130 [2];
  double local_110;
  AssertionResult local_108;
  int local_f4;
  uint local_dc;
  HasNewFatalFailureHelper local_d8;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  int local_b0;
  int local_ac;
  uint local_a8 [7];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  this_00 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",this_00);
  uVar8 = 300;
  uVar7 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,
             (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),(int)in_stack_fffffffffffffdf8,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 200;
  local_a8[1] = 0x226;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var4 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7db49b);
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate = local_a8[*p_Var4];
  (**(code **)((((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(in_RDI->
                     super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
                     super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
                     .super_Test._vptr_Test)->
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl + 0x40))();
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  local_ac = 0;
  local_b0 = 0x96;
  for (local_b4 = 0x65; (int)local_b4 < 200; local_b4 = local_b4 + 1) {
    if ((int)local_b4 % 4 != 0) {
      in_RDI->drop_frames_list_[local_ac] = local_b4;
      local_ac = local_ac + 1;
      if ((int)local_b4 % 2 != 0) {
        local_b0 = local_b0 + -1;
      }
    }
  }
  in_RDI->number_temporal_layers_ = 3;
  in_RDI->number_spatial_layers_ = 3;
  in_RDI->multi_ref_ = 1;
  in_RDI->drop_frames_ = local_ac * in_RDI->number_spatial_layers_;
  local_b8 = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate >> 3;
  in_RDI->target_layer_bitrate_[0] = (int)(local_b8 * 0x32) / 100;
  in_RDI->target_layer_bitrate_[1] = (int)(local_b8 * 0x46) / 100;
  in_RDI->target_layer_bitrate_[2] = local_b8;
  local_bc = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 3 >> 3;
  in_RDI->target_layer_bitrate_[3] = (int)(local_bc * 0x32) / 100;
  in_RDI->target_layer_bitrate_[4] = (int)(local_bc * 0x46) / 100;
  in_RDI->target_layer_bitrate_[5] = local_bc;
  local_c0 = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate >> 1 & 0x1fffffff
  ;
  in_RDI->target_layer_bitrate_[6] = (int)(local_c0 * 0x32) / 100;
  in_RDI->target_layer_bitrate_[7] = (int)(local_c0 * 0x46) / 100;
  in_RDI->target_layer_bitrate_[8] = local_c0;
  bVar1 = testing::internal::AlwaysTrue();
  TVar9 = (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe10)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&in_RDI->super_DatarateTest,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_d8);
    if (bVar1) {
      local_dc = 5;
    }
    else {
      local_dc = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
    TVar9 = (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    if (local_dc == 0) {
      for (local_f4 = 0; local_f4 < in_RDI->number_temporal_layers_ * in_RDI->number_spatial_layers_
          ; local_f4 = local_f4 + 1) {
        local_110 = (double)in_RDI->target_layer_bitrate_[local_f4] * 0.6;
        testing::internal::CmpHelperGE<double,double>
                  (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                   (double *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe10);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffde4,uVar8),
                     (char (*) [61])CONCAT44(in_stack_fffffffffffffddc,uVar7));
          testing::AssertionResult::failure_message((AssertionResult *)0x7db9f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe10,
                     (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)in_RDI);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
          testing::Message::~Message((Message *)0x7dba4a);
        }
        local_dc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7dbad1);
        if (local_dc != 0) goto LAB_007dc00a;
        local_138 = (double)in_RDI->target_layer_bitrate_[local_f4] * 1.6;
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                   (double *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe10);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffde4,uVar8),
                     (char (*) [63])CONCAT44(in_stack_fffffffffffffddc,uVar7));
          testing::AssertionResult::failure_message((AssertionResult *)0x7dbb9e);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe10,
                     (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)in_RDI);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
          testing::Message::~Message((Message *)0x7dbbf8);
        }
        local_dc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7dbc7c);
        if (local_dc != 0) goto LAB_007dc00a;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"          Decoded frames: ");
      uVar2 = GetDecodedFrames(in_RDI);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<((ostream *)&std::cout,"          Mismatch frames: ");
      uVar2 = GetMismatchFrames(in_RDI);
      poVar6 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      std::operator<<(poVar6,"\n");
      TVar9 = (Type)((ulong)poVar6 >> 0x20);
      iVar3 = in_RDI->number_spatial_layers_ * 300;
      uVar2 = GetDecodedFrames(in_RDI);
      local_15c = iVar3 - uVar2;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (uint *)in_stack_fffffffffffffde8,(uint *)CONCAT44(in_stack_fffffffffffffde4,uVar8)
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
      if (!bVar1) {
        testing::Message::Message((Message *)poVar5);
        in_stack_fffffffffffffdf8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x7dbde5);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)poVar5,TVar9,(char *)CONCAT44(iVar3,in_stack_fffffffffffffe00),
                   (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)in_RDI);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
        testing::Message::~Message((Message *)0x7dbe42);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7dbeb0);
      GetMismatchFrames(in_RDI);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (int *)in_stack_fffffffffffffde8,(int *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
      line = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
      if (!bVar1) {
        testing::Message::Message((Message *)poVar5);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x7dbf37);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)poVar5,TVar9,(char *)CONCAT44(iVar3,in_stack_fffffffffffffe00),
                   line,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)in_RDI);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
        testing::Message::~Message((Message *)0x7dbf94);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7dbfff);
      local_dc = 0;
      goto LAB_007dc00a;
    }
    if (local_dc != 5) goto LAB_007dc00a;
  }
  iVar3 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe10);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe10,TVar9,
             (char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar3,
             in_stack_fffffffffffffdf0);
  testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)in_RDI);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
  testing::Message::~Message((Message *)0x7db8be);
  local_dc = 1;
LAB_007dc00a:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7dc017);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLDropSetEnhER0Test() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 200, 550 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    // Set error_resilience off.
    cfg_.g_error_resilient = 0;
    // Drop TL1 and TL2: for part of sequence. Start at first TL2 at
    // frame 101, and end at second T2 at frame 199. Frame 200 is TL0,
    // so we can continue decoding without mismatch (since LAST is the
    // only reference).
    // Drop here means drop whole superframe.
    int n = 0;
#if CONFIG_AV1_DECODER
    int num_nonref = 300 / 2;
#endif
    for (int i = 101; i < 200; i++) {
      if (i % 4 != 0) {
        drop_frames_list_[n] = i;
        n++;
#if CONFIG_AV1_DECODER
        if (i % 2 != 0) num_nonref -= 1;
#endif
      }
    }
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    multi_ref_ = 1;
    drop_frames_ = n * number_spatial_layers_;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.60)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.60)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // Test that no mismatches have been found.
    std::cout << "          Decoded frames: " << GetDecodedFrames() << "\n";
    std::cout << "          Mismatch frames: " << GetMismatchFrames() << "\n";
    EXPECT_EQ(300 * number_spatial_layers_ - GetDecodedFrames(), drop_frames_);
    EXPECT_EQ((int)GetMismatchFrames(), num_nonref);
#endif
  }